

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2-gui.cpp
# Opt level: O3

bool renderSimilarity(TKeyPressCollection *keyPresses,TSimilarityMap *similarityMap)

{
  ulong uVar1;
  double dVar2;
  pointer psVar3;
  TKeyPressCollection *pTVar4;
  bool bVar5;
  ImU32 IVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  uint local_bc;
  ImVec4 local_b8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImDrawList *local_90;
  ImVec2 local_88;
  TKeyPressCollection *local_78;
  ulong local_70;
  ImVec2 local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  fVar12 = stateUI.super_stStateUI.windowHeightTitleBar +
           stateUI.super_stStateUI.windowHeightKeyPesses +
           stateUI.super_stStateUI.windowHeightResults;
  local_b8._0_8_ = (ulong)(uint)(float)(int)fVar12 << 0x20;
  local_a0.x = 0.0;
  local_a0.y = 0.0;
  local_78 = keyPresses;
  ImGui::SetNextWindowPos((ImVec2 *)&local_b8,1,&local_a0);
  local_b8.x = (float)g_windowSizeX;
  local_b8.y = (float)(g_windowSizeY - (int)fVar12);
  ImGui::SetNextWindowSize((ImVec2 *)&local_b8,1);
  bVar5 = ImGui::Begin("Similarity",(bool *)0x0,0x804);
  if (bVar5) {
    local_88 = ImGui::GetContentRegionAvail();
    ImGui::PushItemWidth(100.0);
    uVar8 = (int)((long)(similarityMap->
                        super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(similarityMap->
                        super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
    ImGui::SameLine(0.0,-1.0);
    ImGui::SliderFloat("Size",&renderSimilarity::bsize,1.5,24.0,"%.3f",1.0);
    ImGui::SameLine(0.0,-1.0);
    local_b8.x = 0.0;
    local_b8.y = 0.0;
    bVar5 = ImGui::Button("Fit",(ImVec2 *)&local_b8);
    if (bVar5) {
      fVar12 = local_88.y;
      if (local_88.x <= local_88.y) {
        fVar12 = local_88.x;
      }
      renderSimilarity::bsize = (fVar12 + -24.0) / (float)(int)uVar8;
    }
    ImGui::SameLine(0.0,-1.0);
    ImGui::SliderFloat("Threshold",&renderSimilarity::threshold,0.0,1.0,"%.3f",1.0);
    ImGui::PopItemWidth();
    local_b8.x = 0.0;
    local_b8.y = 0.0;
    ImGui::BeginChild("Canvas",(ImVec2 *)&local_b8,true,0xc800);
    local_68 = ImGui::GetCursorScreenPos();
    local_90 = ImGui::GetWindowDrawList();
    if ((int)uVar8 < 1) {
      local_b8.x = 1.0;
      local_b8.y = 0.3;
      local_b8.z = 0.4;
      local_b8.w = 1.0;
      ImGui::TextColored(&local_b8,"Waiting for similarity map to be available!");
    }
    else {
      local_b8.y = (float)(int)uVar8 * renderSimilarity::bsize;
      local_b8.x = (float)(int)uVar8 * renderSimilarity::bsize;
      local_88 = (ImVec2)similarityMap;
      ImGui::InvisibleButton("SimilarityMapIB",(ImVec2 *)&local_b8);
      uVar7 = (ulong)(uVar8 & 0x7fffffff);
      local_bc = 0xffffffff;
      uVar9 = 0;
      do {
        local_48 = ZEXT416((uint)(float)(int)(uint)uVar9);
        local_70 = uVar9 + 1;
        local_58 = ZEXT416((uint)(float)(int)local_70);
        lVar11 = 0;
        uVar10 = 0;
        do {
          dVar2 = *(double *)(*(long *)(*(long *)local_88 + uVar9 * 0x18) + lVar11);
          local_a0.x = (float)(int)uVar10 * renderSimilarity::bsize + local_68.x;
          local_a0.y = (float)local_48._0_4_ * renderSimilarity::bsize + local_68.y;
          uVar1 = uVar10 + 1;
          local_98.x = (float)(int)uVar1 * renderSimilarity::bsize + local_68.x + -1.0;
          local_98.y = (float)local_58._0_4_ * renderSimilarity::bsize + local_68.y + -1.0;
          fVar12 = local_98.x;
          fVar13 = local_98.y;
          if ((double)renderSimilarity::threshold < dVar2) {
            local_b8.y = (float)dVar2;
            local_b8.x = 1.0 - local_b8.y;
            local_b8._8_8_ = (ulong)(uint)local_b8.y << 0x20;
            IVar6 = ImGui::ColorConvertFloat4ToU32(&local_b8);
            ImDrawList::AddRectFilled(local_90,&local_a0,&local_98,IVar6,0.0,0xf);
            fVar12 = local_98.x;
            fVar13 = local_98.y;
          }
          local_b8.y = fVar13 + 1.0;
          local_b8.x = fVar12 + 1.0;
          bVar5 = ImGui::IsMouseHoveringRect(&local_a0,(ImVec2 *)&local_b8,true);
          if (bVar5) {
            if (uVar9 == uVar10) {
              local_bc = (uint)uVar9;
            }
            bVar5 = ImGui::IsMouseDown(0);
            if (!bVar5) {
              ImGui::BeginTooltip();
              ImGui::Text("[%3d, %3d] = %5.4g\n",
                          *(undefined8 *)(*(long *)(*(long *)local_88 + uVar9 * 0x18) + lVar11),
                          uVar9 & 0xffffffff,uVar10 & 0xffffffff);
              ImGui::EndTooltip();
            }
          }
          pTVar4 = local_78;
          lVar11 = lVar11 + 0x10;
          uVar10 = uVar1;
        } while (uVar7 != uVar1);
        uVar9 = local_70;
      } while (local_70 != uVar7);
      if (-1 < (int)local_bc) {
        uVar9 = 0;
        do {
          psVar3 = (pTVar4->
                   super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                   super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (psVar3[uVar9].cid == psVar3[local_bc].cid) {
            fVar12 = (float)(int)uVar9 * renderSimilarity::bsize;
            local_a0.x = fVar12 + local_68.x;
            local_a0.y = fVar12 + local_68.y;
            fVar12 = (float)((int)uVar9 + 1) * renderSimilarity::bsize;
            local_98.x = fVar12 + local_68.x + -1.0;
            local_98.y = fVar12 + local_68.y + -1.0;
            local_b8.x = 1.0;
            local_b8.y = 0.0;
            local_b8.z = 0.0;
            local_b8.w = 1.0;
            IVar6 = ImGui::ColorConvertFloat4ToU32(&local_b8);
            ImDrawList::AddRectFilled(local_90,&local_a0,&local_98,IVar6,0.0,0xf);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar7);
      }
    }
    ImGui::EndChild();
    stateUI.super_stStateUI.windowHeightSimilarity = ImGui::GetWindowHeight();
  }
  else {
    stateUI.super_stStateUI.windowHeightSimilarity = ImGui::GetTextLineHeightWithSpacing();
  }
  ImGui::End();
  return false;
}

Assistant:

bool renderSimilarity(const TKeyPressCollection & keyPresses, const TSimilarityMap & similarityMap) {
    int offsetY = stateUI.windowHeightTitleBar + stateUI.windowHeightKeyPesses + stateUI.windowHeightResults;
    ImGui::SetNextWindowPos(ImVec2(0, offsetY), ImGuiCond_Always);
    ImGui::SetNextWindowSize(ImVec2(1.0f*g_windowSizeX, g_windowSizeY - offsetY), ImGuiCond_Always);
    if (ImGui::Begin("Similarity", nullptr, ImGuiWindowFlags_HorizontalScrollbar | ImGuiWindowFlags_NoMove)) {
        auto wsize = ImGui::GetContentRegionAvail();

        static float bsize = 10.0f;
        static float threshold = 0.0f;
        ImGui::PushItemWidth(100.0);

        int n = similarityMap.size();
        ImGui::SameLine();
        ImGui::SliderFloat("Size", &bsize, 1.5f, 24.0f);
        ImGui::SameLine();
        if (ImGui::Button("Fit")) {
            bsize = (std::min(wsize.x, wsize.y) - 24.0)/n;
        }
        ImGui::SameLine();
        ImGui::SliderFloat("Threshold", &threshold, 0.0f, 1.0f);
        ImGui::PopItemWidth();

        ImGui::BeginChild("Canvas", { 0, 0 }, 1, ImGuiWindowFlags_HorizontalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar | ImGuiWindowFlags_AlwaysVerticalScrollbar);
        auto savePos = ImGui::GetCursorScreenPos();
        auto drawList = ImGui::GetWindowDrawList();

        int hoveredId = -1;
        if (n > 0) {
            ImGui::InvisibleButton("SimilarityMapIB", { n*bsize, n*bsize });
            for (int i = 0; i < n; ++i) {
                for (int j = 0; j < n; ++j) {
                    float col = similarityMap[i][j].cc;
                    ImVec2 p0 = {savePos.x + j*bsize, savePos.y + i*bsize};
                    ImVec2 p1 = {savePos.x + (j + 1)*bsize - 1.0f, savePos.y + (i + 1)*bsize - 1.0f};
                    if (similarityMap[i][j].cc > threshold) {
                        drawList->AddRectFilled(p0, p1, ImGui::ColorConvertFloat4ToU32(ImVec4{1.0f - col, col, 0.0f, col}));
                    }
                    if (ImGui::IsMouseHoveringRect(p0, {p1.x + 1.0f, p1.y + 1.0f})) {
                        if (i == j) hoveredId = i;
                        if (ImGui::IsMouseDown(0) == false) {
                            ImGui::BeginTooltip();
                            //ImGui::Text("[%3d, %3d]\n", keyPresses[i].cid, keyPresses[j].cid);
                            ImGui::Text("[%3d, %3d] = %5.4g\n", i, j, similarityMap[i][j].cc);
                            //for (int k = 0; k < n; ++k) {
                            //    if (similarityMap[i][k].cc > 0.5) ImGui::Text("Offset [%3d, %3d] = %d\n", i, k, (int) similarityMap[i][k].offset);
                            //}
                            //ImGui::Separator();
                            //for (int k = 0; k < n; ++k) {
                            //    if (similarityMap[k][i].cc > 0.5) ImGui::Text("Offset [%3d, %3d] = %d\n", k, i, (int) similarityMap[k][i].offset);
                            //}
                            ImGui::EndTooltip();
                        }
                    }
                }
            }

            if (hoveredId >= 0) {
                for (int i = 0; i < n; ++i) {
                    if (keyPresses[i].cid == keyPresses[hoveredId].cid) {
                        ImVec2 p0 = {savePos.x + i*bsize, savePos.y + i*bsize};
                        ImVec2 p1 = {savePos.x + (i + 1)*bsize - 1.0f, savePos.y + (i + 1)*bsize - 1.0f};
                        drawList->AddRectFilled(p0, p1, ImGui::ColorConvertFloat4ToU32({1.0f, 0.0f, 0.0f, 1.0f}));
                    }
                }
            }
        } else {
            ImGui::TextColored({1.0f, 0.3f, 0.4f, 1.0f}, "Waiting for similarity map to be available!");
        }

        ImGui::EndChild();

        stateUI.windowHeightSimilarity = ImGui::GetWindowHeight();
    } else {
        stateUI.windowHeightSimilarity = ImGui::GetTextLineHeightWithSpacing();
    }
    ImGui::End();
    return false;
}